

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O2

Vec_Wec_t * Seg_ManCollectObjEdges(Vec_Int_t *vEdges,int nObjs)

{
  int Level;
  int Level_00;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar1;
  int iVar2;
  int Entry;
  
  p = (Vec_Wec_t *)malloc(0x10);
  iVar2 = 8;
  if (6 < nObjs - 1U) {
    iVar2 = nObjs;
  }
  p->nCap = iVar2;
  Entry = 0;
  if (iVar2 == 0) {
    pVVar1 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar1 = (Vec_Int_t *)calloc((long)iVar2,0x10);
  }
  p->pArray = pVVar1;
  p->nSize = nObjs;
  for (iVar2 = 1; iVar2 < vEdges->nSize; iVar2 = iVar2 + 2) {
    Level = Vec_IntEntry(vEdges,iVar2 + -1);
    Level_00 = Vec_IntEntry(vEdges,iVar2);
    Vec_WecPush(p,Level,Entry);
    Vec_WecPush(p,Level_00,Entry);
    Entry = Entry + 1;
  }
  return p;
}

Assistant:

Vec_Wec_t * Seg_ManCollectObjEdges( Vec_Int_t * vEdges, int nObjs )
{
    int iFanin, iObj, i;
    Vec_Wec_t * vRes = Vec_WecStart( nObjs );
    Vec_IntForEachEntryDouble( vEdges, iFanin, iObj, i )
    {
        Vec_WecPush( vRes, iFanin, i/2 );
        Vec_WecPush( vRes, iObj, i/2 );
    }
    return vRes;
}